

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall
t_js_generator::generate_deserialize_container
          (t_js_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  t_type *type;
  uint uVar1;
  ostream *poVar2;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  string i;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  undefined1 local_178 [8];
  t_field fsize;
  string local_c0;
  undefined1 local_a0 [8];
  string rtmp3;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string size;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_js_generator *this_local;
  
  size.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"_size",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"_rtmp3",(allocator *)&fsize.field_0xaf);
  t_generator::tmp((string *)local_a0,(t_generator *)this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&fsize.field_0xaf);
  type = g_type_i32;
  std::__cxx11::string::string((string *)&local_198,(string *)local_48);
  t_field::t_field((t_field *)local_178,type,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
        poVar2 = std::operator<<(out,(string *)&local_278);
        poVar2 = std::operator<<(poVar2,(string *)prefix);
        poVar2 = std::operator<<(poVar2," = [];");
        poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
        poVar2 = std::operator<<(poVar2,(string *)&local_298);
        poVar2 = std::operator<<(poVar2,(string *)&this->js_const_type_);
        poVar2 = std::operator<<(poVar2,(string *)local_a0);
        poVar2 = std::operator<<(poVar2," = input.readListBegin();");
        poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)((long)&i.field_2 + 8),(t_generator *)this);
        poVar2 = std::operator<<(poVar2,(string *)(i.field_2._M_local_buf + 8));
        poVar2 = std::operator<<(poVar2,(string *)&this->js_const_type_);
        poVar2 = std::operator<<(poVar2,(string *)local_48);
        poVar2 = std::operator<<(poVar2," = ");
        poVar2 = std::operator<<(poVar2,(string *)local_a0);
        poVar2 = std::operator<<(poVar2,".size || 0;");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_218);
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2," = [];");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_238);
      poVar2 = std::operator<<(poVar2,(string *)&this->js_const_type_);
      poVar2 = std::operator<<(poVar2,(string *)local_a0);
      poVar2 = std::operator<<(poVar2," = input.readSetBegin();");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_258);
      poVar2 = std::operator<<(poVar2,(string *)&this->js_const_type_);
      poVar2 = std::operator<<(poVar2,(string *)local_48);
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,(string *)local_a0);
      poVar2 = std::operator<<(poVar2,".size || 0;");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_1b8);
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2," = {};");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b8);
    t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_1d8);
    poVar2 = std::operator<<(poVar2,(string *)&this->js_const_type_);
    poVar2 = std::operator<<(poVar2,(string *)local_a0);
    poVar2 = std::operator<<(poVar2," = input.readMapBegin();");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d8);
    t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_1f8);
    poVar2 = std::operator<<(poVar2,(string *)&this->js_const_type_);
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::operator<<(poVar2,(string *)local_a0);
    poVar2 = std::operator<<(poVar2,".size || 0;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"_i",&local_2f9);
  t_generator::tmp((string *)local_2d8,(t_generator *)this,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"for (");
  poVar2 = std::operator<<(poVar2,(string *)&this->js_let_type_);
  poVar2 = std::operator<<(poVar2,(string *)local_2d8);
  poVar2 = std::operator<<(poVar2," = 0; ");
  poVar2 = std::operator<<(poVar2,(string *)local_2d8);
  poVar2 = std::operator<<(poVar2," < ");
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  poVar2 = std::operator<<(poVar2,"; ++");
  poVar2 = std::operator<<(poVar2,(string *)local_2d8);
  poVar2 = std::operator<<(poVar2,") {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_400,(string *)prefix);
        generate_deserialize_list_element(this,out,(t_list *)ttype,&local_400);
        std::__cxx11::string::~string((string *)&local_400);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_3e0,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
    }
  }
  else {
    if ((this->gen_node_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_320);
      poVar2 = std::operator<<(poVar2,"if (");
      poVar2 = std::operator<<(poVar2,(string *)local_2d8);
      poVar2 = std::operator<<(poVar2," > 0 ) {");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_340);
      poVar2 = std::operator<<(poVar2,
                               "  if (input.rstack.length > input.rpos[input.rpos.length -1] + 1) {"
                              );
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_360);
      poVar2 = std::operator<<(poVar2,"    input.rstack.pop();");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_380);
      poVar2 = std::operator<<(poVar2,"  }");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_3a0);
      poVar2 = std::operator<<(poVar2,"}");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_320);
    }
    std::__cxx11::string::string((string *)&local_3c0,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,"input.readListEnd();");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"input.readSetEnd();");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"input.readMapEnd();");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)local_2d8);
  t_field::~t_field((t_field *)local_178);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_js_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  string size = tmp("_size");
  string rtmp3 = tmp("_rtmp3");

  t_field fsize(g_type_i32, size);

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << prefix << " = {};" << endl;

    out << indent() << js_const_type_ << rtmp3 << " = input.readMapBegin();" << endl;
    out << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;

  } else if (ttype->is_set()) {

    out << indent() << prefix << " = [];" << endl
        << indent() << js_const_type_ << rtmp3 << " = input.readSetBegin();" << endl
        << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;

  } else if (ttype->is_list()) {

    out << indent() << prefix << " = [];" << endl
        << indent() << js_const_type_ << rtmp3 << " = input.readListBegin();" << endl
        << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;
  }

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (" << js_let_type_ << i << " = 0; " << i << " < " << size << "; ++" << i << ") {" << endl;

  indent_up();

  if (ttype->is_map()) {
    if (!gen_node_) {
      out << indent() << "if (" << i << " > 0 ) {" << endl << indent()
          << "  if (input.rstack.length > input.rpos[input.rpos.length -1] + 1) {" << endl
          << indent() << "    input.rstack.pop();" << endl << indent() << "  }" << endl << indent()
          << "}" << endl;
    }

    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "input.readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "input.readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "input.readListEnd();" << endl;
  }
}